

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_inst.c
# Opt level: O3

func_type * get_block_type(func_type *__return_storage_ptr__,vm *v,int32 bt)

{
  type_pointer pfVar1;
  type_pointer pfVar2;
  byte *pbVar3;
  undefined4 uVar4;
  uint32 uVar5;
  undefined4 uVar6;
  byte *pbVar7;
  
  *(undefined8 *)&__return_storage_ptr__->return_count = 1;
  __return_storage_ptr__->return_types = (byte *)0x0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  __return_storage_ptr__->param_types = (byte *)0x0;
  if (bt < 0) {
    switch(bt) {
    case -4:
      pbVar7 = fiveBlockReturnType + 3;
      break;
    case -3:
      pbVar7 = fiveBlockReturnType + 2;
      break;
    case -2:
      pbVar7 = fiveBlockReturnType + 1;
      break;
    case -1:
      pbVar7 = fiveBlockReturnType;
      break;
    default:
      __return_storage_ptr__->return_count = 0;
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->param_types = pbVar7;
    return __return_storage_ptr__;
  }
  pfVar2 = (v->m->type_sec).type_segment_addr;
  pfVar1 = pfVar2 + (uint)bt;
  uVar5 = pfVar1->param_count;
  uVar6 = *(undefined4 *)&pfVar1->field_0x4;
  pbVar7 = pfVar1->param_types;
  pfVar2 = pfVar2 + (uint)bt;
  uVar4 = *(undefined4 *)&pfVar2->field_0x14;
  pbVar3 = *(byte **)(&pfVar2->return_count + 2);
  __return_storage_ptr__->return_count = pfVar2->return_count;
  *(undefined4 *)&__return_storage_ptr__->field_0x14 = uVar4;
  __return_storage_ptr__->return_types = pbVar3;
  __return_storage_ptr__->param_count = uVar5;
  *(undefined4 *)&__return_storage_ptr__->field_0x4 = uVar6;
  __return_storage_ptr__->param_types = pbVar7;
  return __return_storage_ptr__;
}

Assistant:

func_type get_block_type(vm *v, int32 bt) {
    struct func_type block_type = {
            .param_count=0,
            .return_count=1,
            .return_types=NULL,
            .param_types=NULL
    };
    if (bt < 0) {
        switch (bt) {
            case BlockTypeI32:
                block_type.param_types = &fiveBlockReturnType[0];
                break;
            case BlockTypeI64:
                block_type.param_types = &fiveBlockReturnType[1];
                break;
            case BlockTypeF32:
                block_type.param_types = &fiveBlockReturnType[2];
                break;
            case BlockTypeF64:
                block_type.param_types = &fiveBlockReturnType[3];
                break;
            default:
                block_type.return_count = 0;
                break;
        }
    } else {
        block_type = *(v->m->type_sec.type_segment_addr + bt);
    }
    return block_type;
}